

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAcurv::NodeIntStateScatter
          (ChNodeFEAcurv *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T)

{
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_68 [56];
  
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &x->super_ChVectorDynamic<double>,(ulong)off_x,3);
  ChVector<double>::operator=((ChVector<double> *)&(this->super_ChNodeFEAbase).field_0x20,local_68);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &x->super_ChVectorDynamic<double>,(ulong)(off_x + 3),3);
  ChVector<double>::operator=(&this->m_ryy,local_68);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &x->super_ChVectorDynamic<double>,(ulong)(off_x + 6),3);
  ChVector<double>::operator=(&this->m_rzz,local_68);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &v->super_ChVectorDynamic<double>,(ulong)off_v,3);
  ChVector<double>::operator=(&this->m_rxx_dt,local_68);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &v->super_ChVectorDynamic<double>,(ulong)(off_v + 3),3);
  ChVector<double>::operator=(&this->m_ryy_dt,local_68);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &v->super_ChVectorDynamic<double>,(ulong)(off_v + 6),3);
  ChVector<double>::operator=(&this->m_rzz_dt,local_68);
  return;
}

Assistant:

void ChNodeFEAcurv::NodeIntStateScatter(const unsigned int off_x,
                                        const ChState& x,
                                        const unsigned int off_v,
                                        const ChStateDelta& v,
                                        const double T) {
    m_rxx = x.segment(off_x + 0, 3);
    m_ryy = x.segment(off_x + 3, 3);
    m_rzz = x.segment(off_x + 6, 3);

    m_rxx_dt = v.segment(off_v + 0, 3);
    m_ryy_dt = v.segment(off_v + 3, 3);
    m_rzz_dt = v.segment(off_v + 6, 3);
}